

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.cc
# Opt level: O0

bool __thiscall kratos::XXHash64::add(XXHash64 *this,void *input,uint64_t length)

{
  uchar uVar1;
  uint uVar2;
  uint local_64;
  uint64_t uStack_60;
  uint i;
  uint64_t s3;
  uint64_t s2;
  uint64_t s1;
  uint64_t s0;
  uchar *stopBlock;
  uchar *stop;
  uchar *data;
  uint64_t length_local;
  void *input_local;
  XXHash64 *this_local;
  
  if ((input == (void *)0x0) || (length == 0)) {
    this_local._7_1_ = false;
  }
  else {
    this->totalLength = length + this->totalLength;
    stop = (uchar *)input;
    data = (uchar *)length;
    if (this->bufferSize + length < 0x20) {
      while (data != (uchar *)0x0) {
        uVar1 = *stop;
        uVar2 = this->bufferSize;
        this->bufferSize = uVar2 + 1;
        this->buffer[uVar2] = uVar1;
        stop = stop + 1;
        data = data + -1;
      }
      this_local._7_1_ = true;
    }
    else {
      stopBlock = (uchar *)((long)input + length);
      s0 = (uint64_t)(stopBlock + -0x20);
      length_local = (uint64_t)input;
      input_local = this;
      if (this->bufferSize != 0) {
        while (this->bufferSize < 0x20) {
          uVar1 = *stop;
          uVar2 = this->bufferSize;
          this->bufferSize = uVar2 + 1;
          this->buffer[uVar2] = uVar1;
          stop = stop + 1;
        }
        process(this->buffer,this->state,this->state + 1,this->state + 2,this->state + 3);
      }
      s1 = this->state[0];
      s2 = this->state[1];
      s3 = this->state[2];
      uStack_60 = this->state[3];
      for (; stop <= s0; stop = stop + 0x20) {
        process(stop,&s1,&s2,&s3,&stack0xffffffffffffffa0);
      }
      this->state[0] = s1;
      this->state[1] = s2;
      this->state[2] = s3;
      this->state[3] = uStack_60;
      this->bufferSize = (int)stopBlock - (int)stop;
      for (local_64 = 0; local_64 < this->bufferSize; local_64 = local_64 + 1) {
        this->buffer[local_64] = stop[local_64];
      }
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool add(const void* input, uint64_t length) {
        // no data ?
        if (!input || length == 0) return false;

        totalLength += length;
        // byte-wise access
        auto const* data = (const unsigned char*)input;

        // unprocessed old data plus new data still fit in temporary buffer ?
        if (bufferSize + length < MaxBufferSize) {
            // just add new data
            while (length-- > 0) buffer[bufferSize++] = *data++;
            return true;
        }

        // point beyond last byte
        const unsigned char* stop = data + length;
        const unsigned char* stopBlock = stop - MaxBufferSize;

        // some data left from previous update ?
        if (bufferSize > 0) {
            // make sure temporary buffer is full (16 bytes)
            while (bufferSize < MaxBufferSize) buffer[bufferSize++] = *data++;

            // process these 32 bytes (4x8)
            process(buffer, state[0], state[1], state[2], state[3]);
        }

        // copying state to local variables helps optimizer A LOT
        uint64_t s0 = state[0], s1 = state[1], s2 = state[2], s3 = state[3];
        // 32 bytes at once
        while (data <= stopBlock) {
            // local variables s0..s3 instead of state[0]..state[3] are much faster
            process(data, s0, s1, s2, s3);
            data += 32;
        }
        // copy back
        state[0] = s0;
        state[1] = s1;
        state[2] = s2;
        state[3] = s3;

        // copy remainder to temporary buffer
        bufferSize = stop - data;
        for (unsigned int i = 0; i < bufferSize; i++) buffer[i] = data[i];

        // done
        return true;
    }